

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  XmlWriter *this_00;
  element_type *peVar2;
  ScopedElement *this_01;
  long in_RDI;
  ScopedElement e;
  SectionStats *in_stack_fffffffffffffeb8;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  string *name;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  XmlFormatting XVar4;
  allocator *paVar3;
  string *in_stack_fffffffffffffee0;
  XmlWriter *in_stack_fffffffffffffee8;
  undefined1 local_f1 [40];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  XVar4 = (XmlFormatting)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  StreamingReporterBase<Catch::XmlReporter>::sectionEnded
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  iVar1 = *(int *)(in_RDI + 0x1b8) + -1;
  *(int *)(in_RDI + 0x1b8) = iVar1;
  if (0 < iVar1) {
    this_00 = (XmlWriter *)(in_RDI + 0x170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"OverallResults",&local_41);
    operator|(Newline,Indent);
    XmlWriter::scopedElement(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,XVar4);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    paVar3 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"successes",paVar3);
    XVar4 = (XmlFormatting)((ulong)paVar3 >> 0x20);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    paVar3 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"failures",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    paVar3 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"expectedFailures",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    peVar2 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x281668);
    iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      name = (string *)local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_f1 + 1),"durationInSeconds",(allocator *)name);
      XmlWriter::ScopedElement::writeAttribute<double>
                ((ScopedElement *)CONCAT44(iVar1,in_stack_fffffffffffffed0),name,
                 (double *)in_stack_fffffffffffffec0);
      std::__cxx11::string::~string((string *)(local_f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f1);
    }
    this_01 = (ScopedElement *)(in_RDI + 0x170);
    operator|(Newline,Indent);
    XmlWriter::endElement(this_00,XVar4);
    XmlWriter::ScopedElement::~ScopedElement(this_01);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }